

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O1

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:82:72)>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  stream_core *psVar1;
  size_t sVar2;
  ulong uVar3;
  want wVar4;
  uint uVar5;
  long lVar6;
  error_category *peVar7;
  ulong uVar8;
  error_code *extraout_RDX;
  error_code *extraout_RDX_00;
  error_code *extraout_RDX_01;
  error_code *extraout_RDX_02;
  error_code *extraout_RDX_03;
  error_code *extraout_RDX_04;
  error_code *ec_00;
  code *op;
  basic_stream_socket<asio::ip::tcp> *pbVar9;
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
  *this_00;
  size_t sVar10;
  implementation_type *piVar11;
  write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>_>
  local_c0;
  error_code local_40;
  
  this->start_ = start;
  sVar10 = bytes_transferred;
  if (start != 1) goto LAB_0011f133;
  do {
    this->bytes_transferred_ = 0;
    op = engine::do_accept;
    if ((this->op_).type_ == client) {
      op = engine::do_connect;
    }
    bytes_transferred = 0;
    wVar4 = engine::perform(&this->core_->engine_,(offset_in_engine_to_subr)op,(void *)0x0,0,
                            (error_code *)0x0,(size_t *)&this->ec_);
    this->want_ = wVar4;
    if (wVar4 == want_input_and_retry) {
      psVar1 = this->core_;
      sVar2 = (psVar1->input_).size_;
      if (sVar2 == 0) {
        this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                   *)&psVar1->pending_read_;
        if ((psVar1->pending_read_).
            super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
            .implementation_.expiry.__d.__r == -0x8000000000000000) {
          piVar11 = &(psVar1->pending_read_).
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                     .implementation_;
          local_c0.stream_ =
               (basic_stream_socket<asio::ip::tcp> *)((ulong)local_c0.stream_._4_4_ << 0x20);
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
          super_const_buffer.data_ = (void *)std::_V2::system_category();
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((((steady_timer *)this_00)->
                   super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                   ).service_,piVar11,(error_code *)&local_c0);
          (piVar11->expiry).__d.__r = 0x7fffffffffffffff;
          pbVar9 = this->next_layer_;
          local_c0.stream_ =
               (basic_stream_socket<asio::ip::tcp> *)(this->core_->input_buffer_).data_;
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
          super_const_buffer.data_ = (void *)(this->core_->input_buffer_).size_;
          goto LAB_0011f52f;
        }
        goto LAB_0011f53c;
      }
      uVar5 = BIO_write((BIO *)(psVar1->engine_).ext_bio_,(psVar1->input_).data_,(int)sVar2);
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      uVar3 = (psVar1->input_).size_;
      if (uVar3 < uVar8) {
        uVar8 = uVar3;
      }
      bytes_transferred = uVar8 + (long)(psVar1->input_).data_;
      psVar1 = this->core_;
      (psVar1->input_).data_ = (void *)bytes_transferred;
      (psVar1->input_).size_ = uVar3 - uVar8;
    }
    else {
      if ((wVar4 == want_output_and_retry) || (wVar4 == want_output)) {
        psVar1 = this->core_;
        this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                   *)&psVar1->pending_write_;
        if ((psVar1->pending_write_).
            super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
            .implementation_.expiry.__d.__r == -0x8000000000000000) {
          piVar11 = &(psVar1->pending_write_).
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                     .implementation_;
          local_c0.stream_ =
               (basic_stream_socket<asio::ip::tcp> *)((ulong)local_c0.stream_._4_4_ << 0x20);
          peVar7 = (error_category *)std::_V2::system_category();
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
          super_const_buffer.data_ = peVar7;
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((((steady_timer *)this_00)->
                   super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                   ).service_,piVar11,(error_code *)&local_c0);
          (piVar11->expiry).__d.__r = 0x7fffffffffffffff;
          pbVar9 = this->next_layer_;
          psVar1 = this->core_;
          uVar5 = BIO_read((BIO *)(psVar1->engine_).ext_bio_,(psVar1->output_buffer_).data_,
                           (int)(psVar1->output_buffer_).size_);
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
          super_const_buffer.size_ = (size_t)uVar5;
          if ((int)uVar5 < 1) {
            local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
            super_const_buffer.size_ = 0;
          }
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
          super_const_buffer.data_ = (psVar1->output_buffer_).data_;
          uVar8 = (psVar1->output_buffer_).size_;
          if (uVar8 < local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_
                      .super_const_buffer.size_) {
            local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
            super_const_buffer.size_ = uVar8;
          }
          local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_ = 0
          ;
          local_c0.start_ = 0;
          local_c0.stream_ = pbVar9;
          io_op(&local_c0.handler_,this);
          local_40._M_value = 0;
          local_40._M_cat = peVar7;
          asio::detail::
          write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:82:72)>_>
          ::operator()(&local_c0,&local_40,0,1);
          if (local_c0.handler_.handler_.socket.
              super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.handler_.handler_.socket.
                       super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c0.handler_.handler_.listener.
              super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.handler_.handler_.listener.
                     super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          return;
        }
LAB_0011f53c:
        basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
        ::
        async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (this_00,this);
        return;
      }
      if (start != 0) {
        pbVar9 = this->next_layer_;
        local_c0.stream_ = (basic_stream_socket<asio::ip::tcp> *)(this->core_->input_buffer_).data_;
        local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
        super_const_buffer.data_ = (void *)0x0;
LAB_0011f52f:
        basic_stream_socket<asio::ip::tcp>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (pbVar9,(mutable_buffers_1 *)&local_c0,this);
        return;
      }
LAB_0011f133:
      uVar8 = 0;
      if ((sVar10 != 0xffffffffffffffff) && (uVar8 = sVar10, (this->ec_)._M_value == 0)) {
        (this->ec_)._M_value = ec._M_value;
        (this->ec_)._M_cat = ec._M_cat;
      }
      sVar10 = uVar8;
      wVar4 = this->want_;
      if (wVar4 == want_input_and_retry) {
        psVar1 = this->core_;
        uVar8 = (psVar1->input_buffer_).size_;
        if (sVar10 <= uVar8) {
          uVar8 = sVar10;
        }
        (psVar1->input_).data_ = (psVar1->input_buffer_).data_;
        (psVar1->input_).size_ = uVar8;
        psVar1 = this->core_;
        uVar5 = BIO_write((BIO *)(psVar1->engine_).ext_bio_,(psVar1->input_).data_,
                          (int)(psVar1->input_).size_);
        uVar8 = 0;
        if (0 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
        }
        uVar3 = (psVar1->input_).size_;
        if (uVar3 < uVar8) {
          uVar8 = uVar3;
        }
        bytes_transferred = uVar8 + (long)(psVar1->input_).data_;
        psVar1 = this->core_;
        (psVar1->input_).data_ = (void *)bytes_transferred;
        (psVar1->input_).size_ = uVar3 - uVar8;
        psVar1 = this->core_;
        local_c0.stream_ =
             (basic_stream_socket<asio::ip::tcp> *)((ulong)local_c0.stream_ & 0xffffffff00000000);
        local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
        super_const_buffer.data_ = (void *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar1->pending_read_).
                 super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                 .service_,
                 &(psVar1->pending_read_).
                  super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                  .implementation_,(error_code *)&local_c0);
        (psVar1->pending_read_).
        super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
        .implementation_.expiry.__d.__r = -0x8000000000000000;
      }
      else {
        if (wVar4 != want_output_and_retry) {
          if (wVar4 == want_output) {
            psVar1 = this->core_;
            local_c0.stream_ =
                 (basic_stream_socket<asio::ip::tcp> *)((ulong)local_c0.stream_._4_4_ << 0x20);
            local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
            super_const_buffer.data_ = (void *)std::_V2::system_category();
            asio::detail::
            deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::cancel((psVar1->pending_write_).
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                     .service_,
                     &(psVar1->pending_write_).
                      super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                      .implementation_,(error_code *)&local_c0);
            (psVar1->pending_write_).
            super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
            .implementation_.expiry.__d.__r = -0x8000000000000000;
          }
          psVar1 = this->core_;
          std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_c0,eof);
          ec_00 = extraout_RDX_02;
          if (((this->ec_)._M_cat ==
               (error_category *)
               local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
               super_const_buffer.data_) && ((this->ec_)._M_value == (int)local_c0.stream_)) {
            bytes_transferred = 0;
            lVar6 = BIO_ctrl((BIO *)(psVar1->engine_).ext_bio_,0xd,0,(void *)0x0);
            if (((int)lVar6 != 0) ||
               (uVar5 = SSL_get_shutdown((SSL *)(psVar1->engine_).ssl_), ec_00 = extraout_RDX_03,
               (uVar5 & 2) == 0)) {
              std::error_code::operator=(&this->ec_,stream_truncated);
              ec_00 = extraout_RDX_04;
            }
          }
          goto LAB_0011f4b0;
        }
        psVar1 = this->core_;
        local_c0.stream_ =
             (basic_stream_socket<asio::ip::tcp> *)((ulong)local_c0.stream_._4_4_ << 0x20);
        local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
        super_const_buffer.data_ = (void *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar1->pending_write_).
                 super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                 .service_,
                 &(psVar1->pending_write_).
                  super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                  .implementation_,(error_code *)&local_c0);
        (psVar1->pending_write_).
        super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
        .implementation_.expiry.__d.__r = -0x8000000000000000;
      }
    }
  } while ((this->ec_)._M_value == 0);
  psVar1 = this->core_;
  std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_c0,eof);
  ec_00 = extraout_RDX;
  if (((this->ec_)._M_cat ==
       (error_category *)
       local_c0.buffers_.super_consuming_single_buffer<asio::const_buffers_1>.buffer_.
       super_const_buffer.data_) && ((this->ec_)._M_value == (int)local_c0.stream_)) {
    bytes_transferred = 0;
    lVar6 = BIO_ctrl((BIO *)(psVar1->engine_).ext_bio_,0xd,0,(void *)0x0);
    if (((int)lVar6 != 0) ||
       (uVar5 = SSL_get_shutdown((SSL *)(psVar1->engine_).ssl_), ec_00 = extraout_RDX_00,
       (uVar5 & 2) == 0)) {
      std::error_code::operator=(&this->ec_,stream_truncated);
      ec_00 = extraout_RDX_01;
    }
  }
LAB_0011f4b0:
  handshake_op::
  call_handler<SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>
            ((handshake_op *)&this->handler_,(type *)&this->ec_,ec_00,(size_t *)bytes_transferred);
  return;
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }